

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O0

void GPU_RegisterRenderer
               (GPU_RendererID id,_func_GPU_Renderer_ptr_GPU_RendererID *create_renderer,
               _func_void_GPU_Renderer_ptr *free_renderer)

{
  GPU_RendererID GVar1;
  int iVar2;
  int i;
  _func_void_GPU_Renderer_ptr *free_renderer_local;
  _func_GPU_Renderer_ptr_GPU_RendererID *create_renderer_local;
  
  GVar1 = id;
  iVar2 = GPU_GetNumRegisteredRenderers();
  if (iVar2 < 10) {
    if (id.renderer == 0) {
      GPU_PushErrorCode("GPU_RegisterRenderer",GPU_ERROR_USER_ERROR,"Invalid renderer ID");
    }
    else if (create_renderer == (_func_GPU_Renderer_ptr_GPU_RendererID *)0x0) {
      GPU_PushErrorCode("GPU_RegisterRenderer",GPU_ERROR_USER_ERROR,"NULL renderer create callback")
      ;
    }
    else if (free_renderer == (_func_void_GPU_Renderer_ptr *)0x0) {
      GPU_PushErrorCode("GPU_RegisterRenderer",GPU_ERROR_USER_ERROR,"NULL renderer free callback");
    }
    else {
      _gpu_renderer_register[iVar2].id.name = id.name;
      _gpu_renderer_register[iVar2].id.renderer = id.renderer;
      _gpu_renderer_register[iVar2].id.major_version = id.major_version;
      id._16_8_ = GVar1._16_8_;
      _gpu_renderer_register[iVar2].id.minor_version = id.minor_version;
      *(undefined4 *)&_gpu_renderer_register[iVar2].id.field_0x14 = id._20_4_;
      _gpu_renderer_register[iVar2].createFn = create_renderer;
      _gpu_renderer_register[iVar2].freeFn = free_renderer;
    }
  }
  return;
}

Assistant:

void GPU_RegisterRenderer(GPU_RendererID id, GPU_Renderer* (*create_renderer)(GPU_RendererID request), void (*free_renderer)(GPU_Renderer* renderer))
{
    int i = GPU_GetNumRegisteredRenderers();
    
	if(i >= GPU_MAX_REGISTERED_RENDERERS)
		return;
    
    if(id.renderer == GPU_RENDERER_UNKNOWN)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "Invalid renderer ID");
        return;
    }
    if(create_renderer == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "NULL renderer create callback");
        return;
    }
    if(free_renderer == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "NULL renderer free callback");
        return;
    }
    
    _gpu_renderer_register[i].id = id;
    _gpu_renderer_register[i].createFn = create_renderer;
    _gpu_renderer_register[i].freeFn = free_renderer;
}